

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::GetEnv(VirtualMachine *this)

{
  char *pcVar1;
  string *val;
  Variable VVar2;
  string *newString;
  char *getEnvVal;
  Variable first;
  VirtualMachine *this_local;
  
  VVar2 = popOpStack(this);
  if (VVar2.type == String) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pcVar1 = getenv(pcVar1);
    if (pcVar1 == (char *)0x0) {
      pushUndefined(this);
    }
    else {
      val = Heap::NewString_abi_cxx11_(&this->heap);
      std::__cxx11::string::clear();
      std::__cxx11::string::assign((char *)val);
      pushString(this,val);
    }
    advance(this);
  }
  else {
    pushUndefined(this);
    advance(this);
  }
  return;
}

Assistant:

void runtime::VirtualMachine::GetEnv() {
  Variable first = this->popOpStack();

  if (first.type != VariableType::String) {
    this->pushUndefined();
    this->advance();
    return;
  }

  auto getEnvVal = std::getenv(first.stringValue->c_str());

  if (getEnvVal == nullptr) {
    this->pushUndefined();

  } else {
    std::string* newString = this->heap.NewString();
    newString->clear();
    newString->assign(getEnvVal);
    this->pushString(newString);
  }

  this->advance();
}